

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::GenerateAndSavePrivateKey(Session *this,Sock *sock)

{
  bool bVar1;
  byte bVar2;
  runtime_error *this_00;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_RDI;
  long in_FS_OFFSET;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  path *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *fmt;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __end;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __beg;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Session *in_stack_ffffffffffffff48;
  undefined2 local_88;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined2 local_70;
  string local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = in_RDI;
  DestGenerate(in_stack_ffffffffffffff48,
               (Sock *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  __end._M_current = (uchar *)&fmt[10]._M_delim;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
  __beg._M_current = (uchar *)&local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff1f,
                      CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),__beg,__end,
             in_stack_ffffffffffffff10);
  bVar1 = WriteBinaryFile((path *)in_RDI,
                          (string *)
                          CONCAT17(in_stack_ffffffffffffff1f,
                                   CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(in_stack_fffffffffffffef8);
  std::allocator<char>::~allocator(&local_79);
  if ((bVar2 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    fs::PathToString_abi_cxx11_(in_stack_ffffffffffffff00);
    _Var3 = fs::quoted(in_stack_ffffffffffffff08);
    local_78 = _Var3._M_string;
    local_88 = _Var3._8_2_;
    local_70 = local_88;
    tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              ((char *)fmt,in_RDI);
    std::runtime_error::runtime_error(this_00,local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Session::GenerateAndSavePrivateKey(const Sock& sock)
{
    DestGenerate(sock);

    // umask is set to 0077 in common/system.cpp, which is ok.
    if (!WriteBinaryFile(m_private_key_file,
                         std::string(m_private_key.begin(), m_private_key.end()))) {
        throw std::runtime_error(
            strprintf("Cannot save I2P private key to %s", fs::quoted(fs::PathToString(m_private_key_file))));
    }
}